

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O2

llama_sampler * llama_sampler_penalties_clone(llama_sampler *smpl)

{
  int32_t *piVar1;
  llama_sampler *plVar2;
  
  piVar1 = (int32_t *)smpl->ctx;
  plVar2 = llama_sampler_init_penalties(*piVar1,(float)piVar1[1],(float)piVar1[2],(float)piVar1[3]);
  ring_buffer<int>::operator=
            ((ring_buffer<int> *)((long)plVar2->ctx + 0x10),(ring_buffer<int> *)(piVar1 + 4));
  return plVar2;
}

Assistant:

static struct llama_sampler * llama_sampler_penalties_clone(const struct llama_sampler * smpl) {
    const auto * ctx = (const llama_sampler_penalties *) smpl->ctx;
    auto * result = llama_sampler_init_penalties(
            ctx->penalty_last_n,
            ctx->penalty_repeat,
            ctx->penalty_freq,
            ctx->penalty_present);

    // copy the state
    {
        auto * result_ctx = (llama_sampler_penalties *) result->ctx;

        result_ctx->prev = ctx->prev;
    }

    return result;
}